

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_acc::build_graph(test_acc *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_context *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *b;
  ggml_tensor *a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  ggml_context *in_stack_ffffffffffffffc8;
  ggml_context *ctx_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  
  uVar3 = *(undefined4 *)(in_RDI + 0x38);
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1a7af2);
  pgVar1 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"a");
  uVar4 = *(undefined4 *)(in_RDI + 0x38);
  ctx_00 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1a7b51);
  pgVar2 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),ctx_00,
                      (ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  ggml_set_param(in_RSI,pgVar2);
  ggml_set_name(pgVar2,"b");
  pgVar1 = (ggml_tensor *)
           ggml_acc(in_RSI,pgVar1,pgVar2,pgVar1->nb[1],pgVar1->nb[2],pgVar1->nb[3],pgVar2->nb[1]);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * b = ggml_new_tensor(ctx, type, 4, ne_b.data());
        ggml_set_param(ctx, b);
        ggml_set_name(b, "b");

        ggml_tensor * out = ggml_acc(ctx, a, b, a->nb[1], a->nb[2], a->nb[3], b->nb[1]);
        ggml_set_name(out, "out");

        return out;
    }